

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_b44.c
# Opt level: O0

exr_result_t
internal_exr_undo_b44
          (exr_decode_pipeline_t *decode,void *compressed_data,uint64_t comp_buf_size,
          void *uncompressed_data,uint64_t uncompressed_size)

{
  exr_decode_pipeline_t *in_RCX;
  exr_decode_pipeline_t *in_RDI;
  uint64_t in_R8;
  exr_result_t rv;
  uint64_t in_stack_00000068;
  void *in_stack_00000070;
  uint64_t in_stack_00000078;
  void *in_stack_00000080;
  exr_decode_pipeline_t *in_stack_00000088;
  void **newsz;
  size_t *cursz;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  exr_result_t local_4;
  
  newsz = &in_RDI->scratch_buffer_1;
  cursz = &in_RDI->scratch_alloc_size_1;
  compute_scratch_buffer_size(in_RDI,in_R8);
  local_4 = internal_decode_alloc_buffer
                      (in_RCX,(exr_transcoding_pipeline_buffer_id_t)(in_R8 >> 0x20),
                       (void **)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),cursz,
                       (size_t)newsz);
  if (local_4 == 0) {
    local_4 = uncompress_b44_impl(in_stack_00000088,in_stack_00000080,in_stack_00000078,
                                  in_stack_00000070,in_stack_00000068);
  }
  return local_4;
}

Assistant:

exr_result_t
internal_exr_undo_b44 (
    exr_decode_pipeline_t* decode,
    const void*            compressed_data,
    uint64_t               comp_buf_size,
    void*                  uncompressed_data,
    uint64_t               uncompressed_size)
{
    exr_result_t rv;
    rv = internal_decode_alloc_buffer (
        decode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(decode->scratch_buffer_1),
        &(decode->scratch_alloc_size_1),
        compute_scratch_buffer_size (decode, uncompressed_size));
    if (rv != EXR_ERR_SUCCESS) return rv;

    return uncompress_b44_impl (
        decode,
        compressed_data,
        comp_buf_size,
        uncompressed_data,
        uncompressed_size);
}